

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphicsplugin_opengl.cpp
# Opt level: O1

shared_ptr<IGraphicsPlugin>
CreateGraphicsPlugin_OpenGL
          (shared_ptr<Options> *options,shared_ptr<IPlatformPlugin> *platformPlugin)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  shared_ptr<IGraphicsPlugin> sVar6;
  
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x2f0);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001268f8;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__OpenGLGraphicsPlugin_00126948;
  memset(&p_Var2[1]._M_use_count,0,0x9f);
  memset(&p_Var2[0xb]._M_use_count,0,0x154);
  uVar3 = 0;
  uVar4 = 0;
  p_Var2[0x21]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[0x21]._M_use_count = 0;
  p_Var2[0x21]._M_weak_count = 0;
  p_Var2[0x22]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[0x22]._M_use_count = 0;
  p_Var2[0x22]._M_weak_count = 0;
  *(undefined8 *)&p_Var2[0x22]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var2[0x23]._vptr__Sp_counted_base + 4) = 0;
  *(undefined4 *)&p_Var2[0x24]._vptr__Sp_counted_base = 0x3b9b23d9;
  p_Var2[0x24]._M_use_count = 0;
  p_Var2[0x24]._M_weak_count = 0;
  p_Var2[0x25]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[0x25]._M_use_count = 0;
  p_Var2[0x26]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[0x26]._M_use_count = 0;
  p_Var2[0x26]._M_weak_count = 0;
  p_Var2[0x27]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[0x28]._vptr__Sp_counted_base = (_func_int **)&p_Var2[0x27]._M_use_count;
  *(_Atomic_word **)&p_Var2[0x27]._M_use_count = &p_Var2[0x27]._M_use_count;
  p_Var2[0x2b]._M_use_count = 0;
  p_Var2[0x2c]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[0x28]._M_use_count = 0;
  p_Var2[0x28]._M_weak_count = 0;
  p_Var2[0x29]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[0x29]._M_use_count = 0;
  p_Var2[0x29]._M_weak_count = 0;
  p_Var2[0x2a]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[0x2a]._M_use_count = 0;
  p_Var2[0x2a]._M_weak_count = 0;
  *(_Atomic_word **)&p_Var2[0x2c]._M_use_count = &p_Var2[0x2b]._M_use_count;
  p_Var2[0x2d]._vptr__Sp_counted_base = (_func_int **)&p_Var2[0x2b]._M_use_count;
  p_Var2[0x2d]._M_use_count = 0;
  p_Var2[0x2d]._M_weak_count = 0;
  iVar1 = *(int *)&(platformPlugin->super___shared_ptr<IPlatformPlugin,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr[0x15]._vptr_IPlatformPlugin;
  if (iVar1 == 3) {
    uVar5 = 0;
  }
  else if (iVar1 == 2) {
    uVar5 = 0x3f80000000000000;
  }
  else {
    uVar5 = 0x3f8000003e9e9e9f;
    uVar3 = 0x3e3cbcbd;
    uVar4 = 0x3e9e9e9f;
  }
  *(undefined4 *)&p_Var2[0x2e]._vptr__Sp_counted_base = uVar3;
  *(undefined4 *)((long)&p_Var2[0x2e]._vptr__Sp_counted_base + 4) = uVar4;
  p_Var2[0x2e]._M_use_count = (_Atomic_word)uVar5;
  p_Var2[0x2e]._M_weak_count = (_Atomic_word)((ulong)uVar5 >> 0x20);
  (options->super___shared_ptr<Options,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)(p_Var2 + 1);
  (options->super___shared_ptr<Options,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var2;
  sVar6.super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar6.super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)options;
  return (shared_ptr<IGraphicsPlugin>)
         sVar6.super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<IGraphicsPlugin> CreateGraphicsPlugin_OpenGL(const std::shared_ptr<Options>& options,
                                                             std::shared_ptr<IPlatformPlugin> platformPlugin) {
    return std::make_shared<OpenGLGraphicsPlugin>(options, platformPlugin);
}